

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Button.cxx
# Opt level: O1

void __thiscall Fl_Button::draw(Fl_Button *this)

{
  Fl_Color fg;
  byte bVar1;
  Fl_Color FVar2;
  Fl_Color *pFVar3;
  bool bVar4;
  
  if ((this->super_Fl_Widget).type_ != '\x03') {
    bVar4 = this->value_ == '\0';
    pFVar3 = &(this->super_Fl_Widget).color2_;
    if (bVar4) {
      pFVar3 = &(this->super_Fl_Widget).color_;
    }
    FVar2 = *pFVar3;
    if (bVar4) {
      bVar1 = (this->super_Fl_Widget).box_;
    }
    else {
      bVar1 = this->down_box_;
      if (bVar1 == 0) {
        bVar1 = (this->super_Fl_Widget).box_;
        bVar1 = 1 < bVar1 | bVar1;
      }
    }
    Fl_Widget::draw_box(&this->super_Fl_Widget,(uint)bVar1,FVar2);
    Fl_Widget::draw_backdrop(&this->super_Fl_Widget);
    if (((this->super_Fl_Widget).label_.type == '\0') && (this->value_ != '\0')) {
      fg = (this->super_Fl_Widget).label_.color;
      FVar2 = fl_contrast(fg,FVar2);
      (this->super_Fl_Widget).label_.color = FVar2;
      Fl_Widget::draw_label(&this->super_Fl_Widget);
      (this->super_Fl_Widget).label_.color = fg;
    }
    else {
      Fl_Widget::draw_label(&this->super_Fl_Widget);
    }
    if ((Fl_Button *)Fl::focus_ == this) {
      Fl_Widget::draw_focus
                (&this->super_Fl_Widget,(uint)(this->super_Fl_Widget).box_,
                 (this->super_Fl_Widget).x_,(this->super_Fl_Widget).y_,(this->super_Fl_Widget).w_,
                 (this->super_Fl_Widget).h_);
      return;
    }
  }
  return;
}

Assistant:

void Fl_Button::draw() {
  if (type() == FL_HIDDEN_BUTTON) return;
  Fl_Color col = value() ? selection_color() : color();
  draw_box(value() ? (down_box()?down_box():fl_down(box())) : box(), col);
  draw_backdrop();
  if (labeltype() == FL_NORMAL_LABEL && value()) {
    Fl_Color c = labelcolor();
    labelcolor(fl_contrast(c, col));
    draw_label();
    labelcolor(c);
  } else draw_label();
  if (Fl::focus() == this) draw_focus();
}